

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O2

void __thiscall SolverTest_TypedSolverOption_Test::TestBody(SolverTest_TypedSolverOption_Test *this)

{
  _func_int **pp_Var1;
  char *message;
  char *in_R9;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_;
  char *s;
  AssertHelper local_318;
  MemoryWriter w;
  TestOption opt;
  
  mp::TypedSolverOption<int>::TypedSolverOption
            (&opt.super_TypedSolverOption<int>,"abc","def",(ValueArrayRef)ZEXT816(0));
  opt.super_TypedSolverOption<int>.super_SolverOption._vptr_SolverOption =
       (_func_int **)&PTR__SolverOption_0025a608;
  opt.value = 0;
  testing::internal::CmpHelperSTREQ
            ((internal *)&w,"\"abc\"","opt.name()","abc",
             opt.super_TypedSolverOption<int>.super_SolverOption.name_._M_dataplus._M_p);
  if ((char)w.super_BasicWriter<char>._vptr_BasicWriter == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (w.super_BasicWriter<char>.buffer_ == (Buffer<char> *)0x0) {
      pp_Var1 = (_func_int **)0x1eb7e0;
    }
    else {
      pp_Var1 = (w.super_BasicWriter<char>.buffer_)->_vptr_Buffer;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/solver-test.cc",
               0x207,(char *)pp_Var1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&w.super_BasicWriter<char>.buffer_);
  testing::internal::CmpHelperSTREQ
            ((internal *)&w,"\"def\"","opt.description()","def",
             opt.super_TypedSolverOption<int>.super_SolverOption.description_._M_dataplus._M_p);
  if ((char)w.super_BasicWriter<char>._vptr_BasicWriter == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (w.super_BasicWriter<char>.buffer_ == (Buffer<char> *)0x0) {
      pp_Var1 = (_func_int **)0x1eb7e0;
    }
    else {
      pp_Var1 = (w.super_BasicWriter<char>.buffer_)->_vptr_Buffer;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/solver-test.cc",
               0x208,(char *)pp_Var1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&w.super_BasicWriter<char>.buffer_);
  gtest_ar_._0_8_ =
       CONCAT71(gtest_ar_._1_7_,opt.super_TypedSolverOption<int>.super_SolverOption.is_flag_) ^ 1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (opt.super_TypedSolverOption<int>.super_SolverOption.is_flag_ != false) {
    testing::Message::Message((Message *)&gtest_ar_4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&w,(internal *)&gtest_ar_,(AssertionResult *)"opt.is_flag()","true","false"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&s,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/solver-test.cc",
               0x209,(char *)w.super_BasicWriter<char>._vptr_BasicWriter);
    testing::internal::AssertHelper::operator=((AssertHelper *)&s,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&s);
    std::__cxx11::string::~string((string *)&w);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_4);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  s = "42";
  mp::TypedSolverOption<int>::Parse(&opt.super_TypedSolverOption<int>,&s,false);
  gtest_ar_._0_8_ = (long)"IntOpt1=42" + 10;
  testing::internal::CmpHelperEQ<char_const*,char_const*>
            ((internal *)&w,"start + 2","s",(char **)&gtest_ar_,&s);
  if ((char)w.super_BasicWriter<char>._vptr_BasicWriter == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (w.super_BasicWriter<char>.buffer_ == (Buffer<char> *)0x0) {
      pp_Var1 = (_func_int **)0x1eb7e0;
    }
    else {
      pp_Var1 = (w.super_BasicWriter<char>.buffer_)->_vptr_Buffer;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/solver-test.cc",
               0x20d,(char *)pp_Var1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&w.super_BasicWriter<char>.buffer_);
  gtest_ar_._0_4_ = 0x2a;
  testing::internal::CmpHelperEQ<int,long_long>
            ((internal *)&w,"42","opt.value",(int *)&gtest_ar_,&opt.value);
  if ((char)w.super_BasicWriter<char>._vptr_BasicWriter == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (w.super_BasicWriter<char>.buffer_ == (Buffer<char> *)0x0) {
      pp_Var1 = (_func_int **)0x1eb7e0;
    }
    else {
      pp_Var1 = (w.super_BasicWriter<char>.buffer_)->_vptr_Buffer;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/solver-test.cc",
               0x20e,(char *)pp_Var1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&w.super_BasicWriter<char>.buffer_);
  w.super_BasicWriter<char>.buffer_ = &w.buffer_.super_Buffer<char>;
  w.super_BasicWriter<char>._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_0025b1f8;
  w.buffer_.super_Buffer<char>.ptr_ = w.buffer_.data_;
  w.buffer_.super_Buffer<char>.size_ = 0;
  w.buffer_.super_Buffer<char>.capacity_ = 500;
  w.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_0025b240;
  mp::TypedSolverOption<int>::Write(&opt.super_TypedSolverOption<int>,&w.super_BasicWriter<char>);
  fmt::BasicWriter<char>::str_abi_cxx11_
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_,
             &w.super_BasicWriter<char>);
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)&gtest_ar_4,"\"42\"","w.str()",(char (*) [3])0x1db20d,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/solver-test.cc",
               0x211,message);
    testing::internal::AssertHelper::operator=(&local_318,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_318);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_4.message_);
  fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter(&w);
  mp::SolverOption::~SolverOption((SolverOption *)&opt);
  return;
}

Assistant:

TestOption(const char *name, const char *description)
    : mp::TypedSolverOption<int>(name, description), value(0) {}